

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

void __thiscall ODDLParser::OpenDDLParser::~OpenDDLParser(OpenDDLParser *this)

{
  clear(this);
  std::_Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::~_Vector_base
            (&(this->m_stack).
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

OpenDDLParser::~OpenDDLParser() {
    clear();
}